

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O3

int SPRKStepSetMethod(void *arkode_mem,ARKodeSPRKTable sprk_storage)

{
  int iVar1;
  ARKodeSPRKTable pAVar2;
  ARKodeSPRKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeSPRKStepMem local_20;
  ARKodeMem local_18;
  
  local_18 = (ARKodeMem)0x0;
  local_20 = (ARKodeSPRKStepMem)0x0;
  iVar1 = sprkStep_AccessARKODEStepMem(arkode_mem,"SPRKStepSetMethod",&local_18,&local_20);
  if (iVar1 == 0) {
    if (local_20->method != (ARKodeSPRKTable)0x0) {
      ARKodeSPRKTable_Free(local_20->method);
      local_20->method = (ARKodeSPRKTable)0x0;
    }
    pAVar2 = ARKodeSPRKTable_Copy(sprk_storage);
    local_20->method = pAVar2;
  }
  return iVar1;
}

Assistant:

int SPRKStepSetMethod(void* arkode_mem, ARKodeSPRKTable sprk_storage)
{
  ARKodeMem ark_mem          = NULL;
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeMem and ARKodeSPRKStepMem structures */
  retval = sprkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  if (step_mem->method)
  {
    ARKodeSPRKTable_Free(step_mem->method);
    step_mem->method = NULL;
  }

  step_mem->method = ARKodeSPRKTable_Copy(sprk_storage);

  return (ARK_SUCCESS);
}